

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O1

char * int2str::impl::detail<10000ull>::convert_step<char*>(number_t x,char *iter)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (x < 10000) {
    *iter = '0';
    if (x < 1000) {
      iter[1] = '0';
      if (99 < x) {
        uVar2 = x / 100;
        iter[2] = (byte)uVar2 | 0x30;
        goto LAB_00108458;
      }
LAB_001083d0:
      iter[2] = '0';
      if (9 < x) {
        bVar1 = (byte)(x / 10);
        iter[3] = bVar1 | 0x30;
        goto LAB_0010848a;
      }
LAB_0010842c:
      iter[3] = '0';
      bVar1 = (byte)x | 0x30;
    }
    else {
      iter[1] = (char)(x / 1000) + '0';
      uVar2 = x % 1000;
      if (uVar2 < 100) goto LAB_0010836f;
      uVar3 = uVar2 / 100;
      iter[2] = (char)uVar3 + '0';
LAB_00108423:
      x = uVar3 * -100 + uVar2;
      if (x < 10) goto LAB_0010842c;
      bVar1 = (byte)(x / 10);
      iter[3] = bVar1 + 0x30;
LAB_0010848a:
      bVar1 = (char)x + bVar1 * -10 + 0x30;
    }
    iter[4] = bVar1;
    goto LAB_001084be;
  }
  *iter = (char)(x / 10000) + '0';
  uVar2 = x % 10000;
  if (uVar2 < 1000) {
    iter[1] = '0';
    if (99 < uVar2) {
      uVar3 = uVar2 / 100;
      iter[2] = (byte)uVar3 | 0x30;
      goto LAB_00108423;
    }
LAB_0010836f:
    iter[2] = '0';
    if (9 < uVar2) {
      bVar1 = (byte)(uVar2 / 10);
      iter[3] = bVar1 | 0x30;
      goto LAB_001084b6;
    }
LAB_00108461:
    iter[3] = '0';
    bVar1 = (byte)uVar2 | 0x30;
  }
  else {
    iter[1] = (char)(uVar2 / 1000) + '0';
    x = uVar2 % 1000;
    if (x < 100) goto LAB_001083d0;
    uVar2 = x / 100;
    iter[2] = (char)uVar2 + '0';
LAB_00108458:
    uVar2 = uVar2 * -100 + x;
    if (uVar2 < 10) goto LAB_00108461;
    bVar1 = (byte)(uVar2 / 10);
    iter[3] = bVar1 + 0x30;
LAB_001084b6:
    bVar1 = (char)uVar2 + bVar1 * -10 + 0x30;
  }
  iter[4] = bVar1;
LAB_001084be:
  return iter + 5;
}

Assistant:

inline static Iter convert_step(number_t x, Iter iter)
    {
        if (N > x)
        {
            *iter++ = '0';
            return detail<N / 10u>::convert_step(x, iter);
        }
        auto const w = x / N;
        *iter++ = static_cast<char>('0' + w);
        return detail<N / 10u>::convert_step(x - w * N, iter);
    }